

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmp-tracking-gain-estimator.cpp
# Opt level: O1

void __thiscall
stateObservation::ZmpTrackingGainEstimator::resetWithMeasurements
          (ZmpTrackingGainEstimator *this,Vector2 *initZMP,Vector3 *initGain,Matrix2 *yaw,
          Vector2 *initZMPUncertainty,Vector3 *initGainUncertainty)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  SrcEvaluatorType srcEvaluator;
  undefined8 *puVar4;
  double *pdVar5;
  CommaInitializer<Eigen::Matrix<double,_5,_5,_0,_5,_5>_> *pCVar6;
  long lVar7;
  char *__function;
  uint uVar8;
  ulong uVar9;
  Index *pIVar10;
  ulong uVar11;
  LinearKalmanFilter *this_00;
  Vector5 x;
  Matrix5 P;
  Index *local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  Vector3 *local_1d0;
  Matrix2 *local_1c8;
  Vector2 *local_1c0;
  DenseStorage<double,__1,__1,__1,_0> local_1b8;
  undefined8 uStack_1a0;
  double local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  double local_178;
  undefined8 local_170 [4];
  undefined8 local_150;
  undefined8 *local_148;
  long lStack_140;
  long local_138;
  double local_130 [21];
  undefined8 *apuStack_88 [2];
  DenseBase<Eigen::Transpose<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>_>
  local_78 [8];
  undefined8 local_70;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>
  local_68 [8];
  undefined8 local_60;
  double local_58 [5];
  
  this_00 = &this->filter_;
  local_1d0 = initGainUncertainty;
  local_1c8 = yaw;
  local_1c0 = initZMPUncertainty;
  KalmanFilterBase::reset(&this_00->super_KalmanFilterBase);
  updateQ_(this);
  updateR_(this);
  local_148 = local_170;
  lStack_140 = 0;
  local_138 = 1;
  local_130[0] = 9.88131291682493e-324;
  memcpy(local_170,initZMP,0x10);
  Eigen::CommaInitializer<Eigen::Matrix<double,5,1,0,5,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,5,1,0,5,1>> *)&local_148,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)initGain);
  if (((long)local_130[0] + lStack_140 == 5) && (local_138 == 1)) {
    local_148 = (undefined8 *)0x0;
    lStack_140 = 0;
    free((void *)0x0);
    puVar4 = (undefined8 *)malloc(0x28);
    if (((ulong)puVar4 & 0xf) != 0) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (puVar4 == (undefined8 *)0x0) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = operator_delete;
      __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_148 = puVar4;
    lStack_140 = 5;
    lVar7 = 0;
    do {
      uVar3 = local_170[lVar7 + 1];
      puVar4[lVar7] = local_170[lVar7];
      (puVar4 + lVar7)[1] = uVar3;
      lVar7 = lVar7 + 2;
    } while (lVar7 == 2);
    puVar4[4] = local_150;
    ZeroDelayObserver::setState((ZeroDelayObserver *)this_00,(StateVector *)&local_148,0);
    free(local_148);
    dVar1 = (local_1c8->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.
            m_data.array[1];
    (this->yaw_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [0] = (local_1c8->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data
          .array[0];
    (this->yaw_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [1] = dVar1;
    dVar1 = (local_1c8->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.
            m_data.array[3];
    (this->yaw_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [2] = (local_1c8->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data
          .array[2];
    (this->yaw_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [3] = dVar1;
    dVar1 = (local_1c0->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
            m_data.array[0];
    dVar2 = (local_1c0->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
            m_data.array[1];
    pdVar5 = local_58;
    local_58[1] = 0.0;
    local_58[2] = 0.0;
    local_58[0] = dVar1 * dVar1;
    local_58[3] = dVar2 * dVar2;
    local_1e8 = 0;
    lVar7 = 2;
    local_1e0 = 2;
    local_1d8 = 2;
    uVar8 = (uint)((ulong)&local_148 >> 3);
    pIVar10 = (Index *)&local_148;
    do {
      uVar9 = (ulong)(uVar8 & 1);
      if (uVar9 != 0) {
        *pIVar10 = (Index)*pdVar5;
      }
      if ((2 - uVar9 & 2) != 0) {
        dVar1 = (pdVar5 + uVar9)[1];
        pIVar10[uVar9] = (Index)pdVar5[uVar9];
        (pIVar10 + uVar9)[1] = (Index)dVar1;
      }
      if (uVar9 != 0) {
        uVar11 = 2 - uVar9 & 0xfffffffffffffffe;
        pIVar10[uVar9 + uVar11] = (Index)pdVar5[uVar9 + uVar11];
      }
      uVar8 = ~(uVar8 & 1);
      pdVar5 = pdVar5 + 2;
      pIVar10 = pIVar10 + 5;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    local_60 = 0;
    local_1f0 = (Index *)&local_148;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>> *)&local_1f0,local_68);
    local_70 = 0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>> *)pCVar6,local_78);
    dVar1 = (local_1d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
            m_data.array[0];
    local_198 = (local_1d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data.array[1];
    local_1b8.m_data = (double *)(dVar1 * dVar1);
    local_198 = local_198 * local_198;
    local_178 = (local_1d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data.array[2];
    local_178 = local_178 * local_178;
    local_1b8.m_rows = 0;
    uStack_190 = 0;
    local_188 = 0;
    uStack_180 = 0;
    local_1b8.m_cols = 0;
    uStack_1a0 = 0;
    Eigen::CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>>::operator_
              ((CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>> *)pCVar6,
               (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_1b8);
    if ((local_1d8 + local_1e8 == 5) && (local_1e0 == 5)) {
      local_1b8.m_data = (double *)0x0;
      local_1b8.m_rows = 0;
      local_1b8.m_cols = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1b8,0x19,5,5);
      if ((local_1b8.m_rows != 5) || (local_1b8.m_cols != 5)) {
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1b8,0x19,5,5);
      }
      if ((local_1b8.m_rows == 5) && (local_1b8.m_cols == 5)) {
        uVar9 = 0xfffffffffffffffe;
        do {
          dVar1 = local_130[uVar9];
          local_1b8.m_data[uVar9 + 2] = local_130[uVar9 - 1];
          (local_1b8.m_data + uVar9 + 2)[1] = dVar1;
          uVar9 = uVar9 + 2;
        } while (uVar9 < 0x16);
        lVar7 = 0x18;
        do {
          local_1b8.m_data[lVar7] = (double)(&local_148)[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x19);
        KalmanFilterBase::setStateCovariance(&this_00->super_KalmanFilterBase,(Pmatrix *)&local_1b8)
        ;
        free(local_1b8.m_data);
        return;
      }
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 5, 5>, T1 = double, T2 = double]"
                   );
    }
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 5, 5>>::finished() [MatrixType = Eigen::Matrix<double, 5, 5>]"
    ;
  }
  else {
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 5, 1>>::finished() [MatrixType = Eigen::Matrix<double, 5, 1>]"
    ;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,__function);
}

Assistant:

void ZmpTrackingGainEstimator::resetWithMeasurements(const Vector2 & initZMP,
                                                     const Vector3 & initGain,
                                                     const Matrix2 & yaw,
                                                     const Vector2 & initZMPUncertainty,
                                                     const Vector3 & initGainUncertainty)
{
  filter_.reset();
  updateQ_();
  updateR_();

  Vector5 x;
  x << initZMP, initGain;
  filter_.setState(x, 0);

  yaw_ = yaw;

  Matrix5 P;
  // clang-format off
  P << Vec2ToSqDiag_(initZMPUncertainty),  Matrix23::Zero(), 
       Matrix23::Zero().transpose(),       Vec3ToSqDiag_(initGainUncertainty);
  // clang-format on
  filter_.setStateCovariance(P);
}